

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_c92d48::HandleWriteImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool append,cmExecutionStatus *status)

{
  string *in_name;
  pointer pbVar1;
  _Ios_Openmode _Var2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  string *psVar6;
  Status SVar7;
  mode_t mode;
  string fileName;
  undefined1 local_308 [48];
  string error_1;
  string message;
  pointer local_298;
  pointer local_290;
  string dir;
  cmAlphaNum local_258;
  ofstream file;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  in_name = pbVar1 + 1;
  std::__cxx11::string::string((string *)&fileName,(string *)in_name);
  bVar5 = cmsys::SystemTools::FileIsFullPath(in_name);
  if (!bVar5) {
    psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    file.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = (psVar6->_M_dataplus)._M_p;
    file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)psVar6->_M_string_length;
    local_308._8_8_ = local_308 + 0x10;
    local_308._0_8_ = &DAT_00000001;
    local_308[0x10] = '/';
    cmStrCat<std::__cxx11::string>
              ((string *)&local_258,(cmAlphaNum *)&file,(cmAlphaNum *)local_308,in_name);
    std::__cxx11::string::operator=((string *)&fileName,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
  }
  bVar5 = cmMakefile::CanIWriteThisFile(status->Makefile,&fileName);
  if (bVar5) {
    cmsys::SystemTools::GetFilenamePath(&dir,&fileName);
    cmsys::SystemTools::MakeDirectory(&dir,(mode_t *)0x0);
    mode = 0;
    SVar7 = cmsys::SystemTools::GetPermissions(&fileName,&mode);
    if (SVar7.Kind_ == Success) {
      bVar4 = true;
      if (-1 < (char)mode) {
        bVar4 = false;
        cmsys::SystemTools::SetPermissions(&fileName,mode | 0x90,false);
      }
    }
    else {
      bVar4 = false;
    }
    _Var2 = _S_out;
    if (append) {
      _Var2 = _S_app;
    }
    std::ofstream::ofstream(&file,fileName._M_dataplus._M_p,_Var2);
    if (((&file.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5
        ) == 0) {
      local_258.View_._M_len = (size_t)(pbVar1 + 2);
      local_258.View_._M_str =
           (char *)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
      local_308._0_8_ = local_308 + 0x10;
      local_308._8_8_ = (char *)0x0;
      local_308[0x10] = '\0';
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_308._0_8_;
      cmJoin(&message,(cmStringRange *)&local_258,(string_view)(auVar3 << 0x40),
             (string_view)ZEXT816(0));
      std::__cxx11::string::~string((string *)local_308);
      std::operator<<(&file.super_basic_ostream<char,_std::char_traits<char>_>,(string *)&message);
      bVar5 = ((&file.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
               [(long)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                      [-3]] & 5) == 0;
      if (bVar5) {
        std::ofstream::close();
        if (!bVar4 && mode != 0) {
          cmsys::SystemTools::SetPermissions(&fileName,mode,false);
        }
      }
      else {
        local_308._0_8_ = (pointer)0xe;
        local_308._8_8_ = "write failed (";
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        local_258.View_._M_len = (size_t)local_290;
        local_258.View_._M_str = (char *)local_298;
        cmStrCat<char[6],std::__cxx11::string>
                  (&error_1,(cmAlphaNum *)local_308,&local_258,(char (*) [6])"):\n  ",&fileName);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&error_1);
      }
      std::__cxx11::string::~string((string *)&message);
    }
    else {
      local_308._0_8_ = (pointer)0x1c;
      local_308._8_8_ = "failed to open for writing (";
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      local_258.View_._M_len = error_1._M_string_length;
      local_258.View_._M_str = error_1._M_dataplus._M_p;
      cmStrCat<char[6],std::__cxx11::string>
                (&message,(cmAlphaNum *)local_308,&local_258,(char (*) [6])"):\n  ",&fileName);
      std::__cxx11::string::~string((string *)&error_1);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&message);
      bVar5 = false;
    }
    std::ofstream::~ofstream(&file);
    std::__cxx11::string::~string((string *)&dir);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                   "attempted to write a file: ",&fileName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                   " into a source directory.");
    std::__cxx11::string::~string((string *)local_308);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    cmSystemTools::s_FatalErrorOccurred = true;
    std::__cxx11::string::~string((string *)&file);
    bVar5 = false;
  }
  std::__cxx11::string::~string((string *)&fileName);
  return bVar5;
}

Assistant:

bool HandleWriteImpl(std::vector<std::string> const& args, bool append,
                     cmExecutionStatus& status)
{
  auto i = args.begin();

  i++; // Get rid of subcommand

  std::string fileName = *i;
  if (!cmsys::SystemTools::FileIsFullPath(*i)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', *i);
  }

  i++;

  if (!status.GetMakefile().CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    status.SetError(e);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName, mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName, newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       append ? std::ios::app : std::ios::out);
  if (!file) {
    std::string error =
      cmStrCat("failed to open for writing (",
               cmSystemTools::GetLastSystemError(), "):\n  ", fileName);
    status.SetError(error);
    return false;
  }
  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());
  file << message;
  if (!file) {
    std::string error =
      cmStrCat("write failed (", cmSystemTools::GetLastSystemError(), "):\n  ",
               fileName);
    status.SetError(error);
    return false;
  }
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName, mode);
  }
  return true;
}